

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O2

void __thiscall
poincare_disc::Distance<double>::backward
          (Distance<double> *this,Vector<double> *grad_u,Vector<double> *grad_v,real grad_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = this->gamma_;
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    Vector<double>::zero_(grad_u);
    Vector<double>::zero_(grad_v);
    return;
  }
  dVar1 = dVar1 * dVar1 + -1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar3 = (4.0 / dVar1) * grad_output;
  dVar2 = dVar3 / this->beta_;
  dVar1 = this->alpha_;
  dVar3 = dVar3 / dVar1;
  Vector<double>::assign_
            (grad_u,((((this->vv_ - (this->uv_ + this->uv_)) + 1.0) * dVar2) / dVar1) / dVar1,
             &this->u_);
  Vector<double>::add_(grad_u,-dVar2 / this->alpha_,&this->v_);
  Vector<double>::assign_
            (grad_v,((((this->uu_ - (this->uv_ + this->uv_)) + 1.0) * dVar3) / this->beta_) /
                    this->beta_,&this->v_);
  Vector<double>::add_(grad_v,-dVar3 / this->beta_,&this->u_);
  return;
}

Assistant:

void backward(Vector<real>& grad_u, Vector<real>& grad_v, real grad_output)
    {
      real c = grad_output;
      
      if(gamma_ == 1){
        grad_u.zero_();
        grad_v.zero_();
        return;
      }

      c *= 4 / std::sqrt(gamma_ * gamma_ - 1);
      real cu = c / beta_; 
      real cv = c / alpha_;
  
      grad_u.assign_(cu * (vv_ - 2 * uv_ + 1) / alpha_ / alpha_, u_);
      grad_u.add_(-cu / alpha_, v_);

      grad_v.assign_(cv * (uu_ - 2 * uv_ + 1) / beta_ / beta_, v_);
      grad_v.add_(-cv / beta_, u_);
      
    }